

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_implicit_module
                 (lyd_node **tree,lys_module *module,uint32_t implicit_options,lyd_node **diff)

{
  lysc_node *plVar1;
  ly_ctx *plVar2;
  char *pcVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  lyd_node *plVar6;
  lyd_node **diff_00;
  ly_ht *getnext_ht;
  lyd_node *d;
  ly_set node_when;
  
  d = (lyd_node *)0x0;
  node_when.size = 0;
  node_when.count = 0;
  node_when.field_2.dnodes = (lyd_node **)0x0;
  getnext_ht = (ly_ht *)0x0;
  if (tree == (lyd_node **)0x0) {
    pcVar3 = "parent || tree";
  }
  else {
    if (module != (lys_module *)0x0) {
      plVar6 = *tree;
      if (plVar6 != (lyd_node *)0x0) {
        plVar1 = plVar6->schema;
        if (plVar1 == (lysc_node *)0x0) {
          plVar2 = (ly_ctx *)plVar6[2].schema;
        }
        else {
          plVar2 = plVar1->module->ctx;
        }
        if ((plVar2 != (ly_ctx *)0x0) && (module->ctx != (ly_ctx *)0x0)) {
          if (plVar1 == (lysc_node *)0x0) {
            plVar5 = (lys_module *)&plVar6[2].schema;
          }
          else {
            plVar5 = plVar1->module;
          }
          if (plVar5->ctx != module->ctx) {
            if (plVar1 == (lysc_node *)0x0) {
              plVar5 = (lys_module *)&plVar6[2].schema;
            }
            else {
              plVar5 = plVar1->module;
            }
            ly_log(plVar5->ctx,LY_LLERR,LY_EINVAL,
                   "Different contexts mixed in a single function call.");
            return LY_EINVAL;
          }
        }
      }
      if (diff != (lyd_node **)0x0) {
        *diff = (lyd_node *)0x0;
      }
      LVar4 = lyd_val_getnext_ht_new(&getnext_ht);
      if ((LVar4 == LY_SUCCESS) &&
         (LVar4 = lyd_new_implicit((lyd_node *)0x0,tree,(lysc_node *)0x0,module,&node_when,
                                   (ly_set *)0x0,(ly_set *)0x0,implicit_options,getnext_ht,diff),
         LVar4 == LY_SUCCESS)) {
        LVar4 = lyd_validate_unres(tree,module,LYD_TYPE_DATA_YANG,&node_when,1,(ly_set *)0x0,
                                   (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,0,diff);
        if (LVar4 == LY_SUCCESS) {
          diff_00 = &d;
          if (diff == (lyd_node **)0x0) {
            diff_00 = (lyd_node **)0x0;
          }
          plVar6 = *tree;
          while ((LVar4 = LY_SUCCESS, plVar6 != (lyd_node *)0x0 &&
                 (LVar4 = lyd_new_implicit_tree(plVar6,implicit_options,diff_00),
                 LVar4 == LY_SUCCESS))) {
            if (d != (lyd_node *)0x0) {
              lyd_insert_sibling(*diff,d,diff);
              d = (lyd_node *)0x0;
            }
            plVar6 = plVar6->next;
          }
        }
      }
      ly_set_erase(&node_when,(_func_void_void_ptr *)0x0);
      lyd_val_getnext_ht_free(getnext_ht);
      if (diff == (lyd_node **)0x0) {
        return LVar4;
      }
      if (LVar4 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      lyd_free_all(*diff);
      *diff = (lyd_node *)0x0;
      return LVar4;
    }
    pcVar3 = "parent || module";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3 + 10,
         "lyd_new_implicit_module");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_implicit_module(struct lyd_node **tree, const struct lys_module *module, uint32_t implicit_options,
        struct lyd_node **diff)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyd_node *root, *d = NULL;
    struct ly_set node_when = {0};
    struct ly_ht *getnext_ht = NULL;

    LY_CHECK_ARG_RET(NULL, tree, module, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(*tree ? LYD_CTX(*tree) : NULL, module ? module->ctx : NULL, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }

    /* create the getnext hash table for this module */
    LY_CHECK_GOTO(rc = lyd_val_getnext_ht_new(&getnext_ht), cleanup);

    /* add all top-level defaults for this module */
    rc = lyd_new_implicit(NULL, tree, NULL, module, &node_when, NULL, NULL, implicit_options, getnext_ht, diff);
    LY_CHECK_GOTO(rc, cleanup);

    /* resolve when and remove any invalid defaults */
    LY_CHECK_GOTO(rc = lyd_validate_unres(tree, module, 0, &node_when, LYXP_IGNORE_WHEN, NULL, NULL, NULL, NULL,
            0, diff), cleanup);

    /* process top-level (and nested) nodes */
    LY_LIST_FOR(*tree, root) {
        LY_CHECK_GOTO(rc = lyd_new_implicit_tree(root, implicit_options, diff ? &d : NULL), cleanup);

        if (d) {
            /* merge into one diff */
            lyd_insert_sibling(*diff, d, diff);
            d = NULL;
        }
    }

cleanup:
    ly_set_erase(&node_when, NULL);
    lyd_val_getnext_ht_free(getnext_ht);
    if (rc && diff) {
        lyd_free_all(*diff);
        *diff = NULL;
    }
    return rc;
}